

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::TimedExecution>::operator()
          (AsyncQueue<nrg::TimedExecution> *this,duration<long,_std::ratio<1L,_1000L>_> *param,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_char_ptr_ptr *param_2,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_3,
          char (*param_4) [12])

{
  std::mutex::lock(&this->guard_);
  TimedExecution::
  push<long,std::ratio<1l,1000l>,void(*)(std::ostream&,char_const*const&),std::reference_wrapper<std::ostream>,char_const(&)[12]>
            (&this->queue_,param,param_2,param_3,param_4);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }